

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mySet.cpp
# Opt level: O1

mySet<float,_myComparator<float>_> * __thiscall
mySet<float,_myComparator<float>_>::operator=
          (mySet<float,_myComparator<float>_> *this,mySet<float,_myComparator<float>_> *ob)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  
  if (this != ob) {
    if (this->data != (float *)0x0) {
      operator_delete__(this->data);
    }
    uVar1 = ob->data_size;
    this->data_size = uVar1;
    uVar5 = 0xffffffffffffffff;
    if (-3 < (long)ob->data_size) {
      uVar5 = (long)ob->data_size * 4 + 8;
    }
    pfVar3 = (float *)operator_new__(uVar5);
    this->data = pfVar3;
    if (0 < (int)uVar1) {
      pfVar2 = ob->data;
      lVar4 = 1;
      do {
        pfVar3[lVar4] = pfVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while ((ulong)uVar1 + 1 != lVar4);
    }
  }
  return this;
}

Assistant:

mySet<T, C>& mySet<T, C>::operator=(mySet<T, C>const& ob)
{
    if(this != &ob)
    {
            delete[] data;
            data_size = ob.data_size;
            data = new T[ob.data_size+2];
            for(int i =1; i < data_size+1; i++)
            data[i] = ob.data[i];
    }
    return *this;
}